

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O1

int ffrwrg(char *rowlist,LONGLONG maxrows,int maxranges,int *numranges,long *minrow,long *maxrow,
          int *status)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  ushort **ppuVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  char *local_50;
  int local_44;
  char *local_40;
  LONGLONG *local_38;
  
  iVar3 = *status;
  if (iVar3 < 1) {
    if (maxrows < 1) {
      *status = 0x7e;
      pcVar6 = "Input maximum range value is <= 0 (fits_parse_ranges)";
    }
    else {
      *numranges = 0;
      local_50 = rowlist + -1;
      do {
        pcVar6 = local_50 + 1;
        local_50 = local_50 + 1;
        local_44 = maxranges;
        local_40 = rowlist;
      } while (*pcVar6 == ' ');
LAB_00116056:
      pcVar6 = local_50;
      cVar2 = *local_50;
      lVar7 = 1;
      if (cVar2 != '-') {
        if (cVar2 != '\0') {
          ppuVar4 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar4 + (long)cVar2 * 2 + 1) & 8) != 0) {
            lVar7 = strtol(pcVar6,&local_50,10);
            pcVar6 = local_50;
            maxranges = local_44;
            goto LAB_001160bf;
          }
LAB_001161dc:
          *status = 0x7e;
          pcVar6 = "Syntax error in this row range list:";
          goto LAB_001161ee;
        }
        if (*numranges == 0) {
          *minrow = 1;
          *maxrow = maxrows;
          *numranges = 1;
        }
        goto LAB_0011620c;
      }
LAB_001160bf:
      for (; cVar2 = *pcVar6, cVar2 == ' '; pcVar6 = pcVar6 + 1) {
      }
      lVar5 = lVar7;
      local_50 = pcVar6;
      if ((cVar2 != '\0') && (cVar2 != ',')) {
        if (cVar2 != '-') goto LAB_001161dc;
        do {
          cVar2 = pcVar6[1];
          pcVar6 = pcVar6 + 1;
        } while ((long)cVar2 == 0x20);
        local_50 = pcVar6;
        local_38 = maxrow;
        ppuVar4 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar4 + (long)cVar2 * 2 + 1) & 8) == 0) {
          lVar5 = maxrows;
          maxrow = local_38;
          maxranges = local_44;
          if ((cVar2 != '\0') && (cVar2 != ',')) goto LAB_001161dc;
        }
        else {
          lVar5 = strtol(pcVar6,&local_50,10);
          maxrow = local_38;
          maxranges = local_44;
        }
      }
      iVar3 = *numranges;
      if (maxranges <= iVar3) {
        *status = 0x7e;
        pcVar6 = "Overflowed maximum number of ranges (fits_parse_ranges)";
        goto LAB_00116207;
      }
      if (lVar7 < 1) {
        *status = 0x7e;
        pcVar6 = "Syntax error in this row range list: row number < 1";
        goto LAB_001161ee;
      }
      if (lVar5 < lVar7) {
        *status = 0x7e;
        pcVar6 = "Syntax error in this row range list: min > max";
        goto LAB_001161ee;
      }
      if ((iVar3 < 1) || (maxrow[(long)iVar3 + -1] < lVar7)) {
        if (lVar7 <= maxrows) {
          if (maxrows <= lVar5) {
            lVar5 = maxrows;
          }
          minrow[iVar3] = lVar7;
          maxrow[iVar3] = lVar5;
          *numranges = iVar3 + 1;
        }
        for (; *local_50 == ' '; local_50 = local_50 + 1) {
        }
        if (*local_50 == ',') {
          do {
            pcVar6 = local_50 + 1;
            pcVar1 = local_50 + 1;
            local_50 = pcVar6;
          } while (*pcVar1 == ' ');
        }
        goto LAB_00116056;
      }
      *status = 0x7e;
      ffpmsg("Syntax error in this row range list.  Range minimum is");
      pcVar6 = "  less than or equal to previous range maximum";
LAB_001161ee:
      ffpmsg(pcVar6);
      pcVar6 = local_40;
    }
LAB_00116207:
    ffpmsg(pcVar6);
LAB_0011620c:
    iVar3 = *status;
  }
  return iVar3;
}

Assistant:

int ffrwrg(
      char *rowlist,      /* I - list of rows and row ranges */
      LONGLONG maxrows,       /* I - number of rows in the table */
      int maxranges,     /* I - max number of ranges to be returned */
      int *numranges,    /* O - number ranges returned */
      long *minrow,       /* O - first row in each range */
      long *maxrow,       /* O - last row in each range */
      int *status)        /* IO - status value */
{
/*
   parse the input list of row ranges, returning the number of ranges,
   and the min and max row value in each range. 

   The only characters allowed in the input rowlist are 
       decimal digits, minus sign, and comma (and non-significant spaces) 

   Example:  

     list = "10-20, 30-35,50"

   would return numranges = 3, minrow[] = {10, 30, 50}, maxrow[] = {20, 35, 50}

   error is returned if min value of range is > max value of range or if the
   ranges are not monotonically increasing.
*/
    char *next;
    long minval, maxval;

    if (*status > 0)
        return(*status);

    if (maxrows <= 0 ) {
        *status = RANGE_PARSE_ERROR;
        ffpmsg("Input maximum range value is <= 0 (fits_parse_ranges)");
        return(*status);
    }

    next = rowlist;
    *numranges = 0;

    while (*next == ' ')next++;   /* skip spaces */
   
    while (*next != '\0') {

      /* find min value of next range; *next must be '-' or a digit */
      if (*next == '-') {
          minval = 1;    /* implied minrow value = 1 */
      } else if ( isdigit((int) *next) ) {
          minval = strtol(next, &next, 10);
      } else {
          *status = RANGE_PARSE_ERROR;
          ffpmsg("Syntax error in this row range list:");
          ffpmsg(rowlist);
          return(*status);
      }

      while (*next == ' ')next++;   /* skip spaces */

      /* find max value of next range; *next must be '-', or ',' */
      if (*next == '-') {
          next++;
          while (*next == ' ')next++;   /* skip spaces */

          if ( isdigit((int) *next) ) {
              maxval = strtol(next, &next, 10);
          } else if (*next == ',' || *next == '\0') {
              maxval = (long) maxrows;  /* implied max value */
          } else {
              *status = RANGE_PARSE_ERROR;
              ffpmsg("Syntax error in this row range list:");
              ffpmsg(rowlist);
              return(*status);
          }
      } else if (*next == ',' || *next == '\0') {
          maxval = minval;  /* only a single integer in this range */
      } else {
          *status = RANGE_PARSE_ERROR;
          ffpmsg("Syntax error in this row range list:");
          ffpmsg(rowlist);
          return(*status);
      }

      if (*numranges + 1 > maxranges) {
          *status = RANGE_PARSE_ERROR;
          ffpmsg("Overflowed maximum number of ranges (fits_parse_ranges)");
          return(*status);
      }

      if (minval < 1 ) {
          *status = RANGE_PARSE_ERROR;
          ffpmsg("Syntax error in this row range list: row number < 1");
          ffpmsg(rowlist);
          return(*status);
      }

      if (maxval < minval) {
          *status = RANGE_PARSE_ERROR;
          ffpmsg("Syntax error in this row range list: min > max");
          ffpmsg(rowlist);
          return(*status);
      }

      if (*numranges > 0) {
          if (minval <= maxrow[(*numranges) - 1]) {
             *status = RANGE_PARSE_ERROR;
             ffpmsg("Syntax error in this row range list.  Range minimum is");
             ffpmsg("  less than or equal to previous range maximum");
             ffpmsg(rowlist);
             return(*status);
         }
      }

      if (minval <= maxrows) {   /* ignore range if greater than maxrows */
          if (maxval > maxrows)
              maxval = (long) maxrows;

           minrow[*numranges] = minval;
           maxrow[*numranges] = maxval;

           (*numranges)++;
      }

      while (*next == ' ')next++;   /* skip spaces */
      if (*next == ',') {
           next++;
           while (*next == ' ')next++;   /* skip more spaces */
      }
    }

    if (*numranges == 0) {  /* a null string was entered */
         minrow[0] = 1;
         maxrow[0] = (long) maxrows;
         *numranges = 1;
    }

    return(*status);
}